

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-history.c
# Opt level: O0

_Bool history_add(player *p,char *text,wchar_t type)

{
  _Bool _Var1;
  bitflag local_1e [2];
  wchar_t local_1c;
  bitflag flags [2];
  char *pcStack_18;
  wchar_t type_local;
  char *text_local;
  player *p_local;
  
  local_1c = type;
  pcStack_18 = text;
  flag_wipe(local_1e,2);
  flag_on_dbg(local_1e,2,local_1c,"flags","type");
  _Var1 = history_add_with_flags(p,pcStack_18,local_1e,(artifact *)0x0);
  return _Var1;
}

Assistant:

bool history_add(struct player *p, const char *text, int type)
{
	bitflag flags[HIST_SIZE];
	hist_wipe(flags);
	hist_on(flags, type);

	return history_add_with_flags(p, text, flags, NULL);
}